

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O1

nng_err nni_http_set_header(nng_http *conn,char *key,char *val)

{
  _Bool _Var1;
  int iVar2;
  undefined8 *puVar3;
  char *pcVar4;
  nng_err nVar5;
  nng_http_res *pnVar6;
  nni_list *list;
  
  _Var1 = http_set_known_header(conn,key,val);
  nVar5 = NNG_OK;
  if (!_Var1) {
    pnVar6 = &conn->res;
    if (conn->client != false) {
      pnVar6 = (nng_http_res *)&conn->req;
    }
    list = &(pnVar6->data).hdrs;
    for (puVar3 = (undefined8 *)nni_list_first(list); puVar3 != (undefined8 *)0x0;
        puVar3 = (undefined8 *)nni_list_next(list,puVar3)) {
      iVar2 = nni_strcasecmp(key,(char *)*puVar3);
      if (iVar2 == 0) {
        pcVar4 = nni_strdup(val);
        if (pcVar4 != (char *)0x0) {
          if ((*(byte *)(puVar3 + 4) & 2) == 0) {
            nni_strfree((char *)puVar3[1]);
            puVar3[1] = 0;
          }
          puVar3[1] = pcVar4;
          return NNG_OK;
        }
        goto LAB_00138b53;
      }
    }
    puVar3 = (undefined8 *)nni_zalloc(0x28);
    if (puVar3 != (undefined8 *)0x0) {
      *(byte *)(puVar3 + 4) = *(byte *)(puVar3 + 4) | 4;
      pcVar4 = nni_strdup(key);
      *puVar3 = pcVar4;
      if (pcVar4 != (char *)0x0) {
        pcVar4 = nni_strdup(val);
        puVar3[1] = pcVar4;
        if (pcVar4 != (char *)0x0) {
          nni_list_append(list,puVar3);
          return NNG_OK;
        }
        nni_strfree((char *)*puVar3);
      }
      nni_free(puVar3,0x28);
    }
LAB_00138b53:
    nVar5 = NNG_ENOMEM;
  }
  return nVar5;
}

Assistant:

static nng_err
http_set_header(nng_http *conn, const char *key, const char *val)
{
	nni_http_entity *data =
	    conn->client ? &conn->req.data : &conn->res.data;
	http_header *h;

	NNI_LIST_FOREACH (&data->hdrs, h) {
		if (nni_strcasecmp(key, h->name) == 0) {
			char *news;
			if ((news = nni_strdup(val)) == NULL) {
				return (NNG_ENOMEM);
			}
			if (!h->static_value) {
				nni_strfree(h->value);
				h->value = NULL;
			}
			h->value = news;
			return (NNG_OK);
		}
	}

	if ((h = NNI_ALLOC_STRUCT(h)) == NULL) {
		return (NNG_ENOMEM);
	}
	h->alloc_header = true;
	if ((h->name = nni_strdup(key)) == NULL) {
		NNI_FREE_STRUCT(h);
		return (NNG_ENOMEM);
	}
	if ((h->value = nni_strdup(val)) == NULL) {
		nni_strfree(h->name);
		NNI_FREE_STRUCT(h);
		return (NNG_ENOMEM);
	}
	nni_list_append(&data->hdrs, h);
	return (NNG_OK);
}